

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_huf.c
# Opt level: O1

exr_result_t
fasthuf_decode(exr_const_context_t pctxt,FastHufDecoder *fhd,uint8_t *src,uint64_t numSrcBits,
              uint16_t *dst,uint64_t numDstElems)

{
  uint16_t uVar1;
  uint32_t uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  char *pcVar12;
  ulong *puVar13;
  uint uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  int iVar22;
  undefined1 auVar23 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  int iVar41;
  int iVar44;
  undefined1 auVar42 [16];
  int iVar45;
  undefined1 auVar43 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  ulong local_78;
  uint32_t local_5c;
  long lVar24;
  
  puVar13 = (ulong *)(src + 0x10);
  uVar17 = numSrcBits - 0x80;
  uVar3 = *(ulong *)src;
  uVar18 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = *(ulong *)(src + 8);
  uVar19 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
           (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
           (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
  uVar3 = fhd->_tableMin;
  uVar2 = fhd->_rleSymbol;
  iVar7 = 0x40;
  local_78 = 0;
  iVar8 = 0x40;
  auVar49 = _DAT_00136090;
  auVar50 = _DAT_001360a0;
  auVar51 = _DAT_001360b0;
  auVar52 = _DAT_001360c0;
  auVar53 = _DAT_001360e0;
  do {
    if (numDstElems <= local_78) {
      if (uVar17 == 0) {
        return 0;
      }
      if (pctxt == (exr_const_context_t)0x0) {
        return 0x17;
      }
      (*pctxt->print_error)
                (pctxt,0x17,
                 "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)"
                 ,uVar17 & 0xffffffff);
      return 0x17;
    }
    iVar11 = iVar8;
    if (uVar18 < uVar3) {
      while (iVar11 < 0x40) {
        if (0 < iVar11) {
          iVar10 = 0x40 - iVar11;
          uVar18 = uVar18 | uVar19 >> ((byte)iVar11 & 0x3f);
          if (iVar10 <= iVar7) {
            uVar19 = uVar19 << ((byte)iVar10 & 0x3f);
            iVar8 = 0x40;
            iVar7 = iVar7 - iVar10;
            break;
          }
          iVar7 = iVar11 + iVar7;
          uVar19 = uVar18;
        }
        if (uVar17 < 0x40) {
          if (uVar17 < 8) {
            lVar9 = 0x38;
            uVar20 = 0;
          }
          else {
            lVar9 = 0x38;
            uVar20 = 0;
            puVar16 = puVar13;
            do {
              uVar20 = uVar20 | (ulong)(byte)*puVar16 << ((byte)lVar9 & 0x3f);
              puVar16 = (ulong *)((long)puVar16 + 1);
              lVar24 = lVar9 + uVar17;
              lVar9 = lVar9 + -8;
            } while (7 < lVar24 - 0x40U);
            puVar13 = (ulong *)((long)puVar13 + (uVar17 - 8 >> 3) + 1);
            uVar17 = (uVar17 + lVar9) - 0x38;
          }
          if (uVar17 != 0) {
            uVar20 = uVar20 | (ulong)(byte)*puVar13 << ((byte)lVar9 & 0x3f);
            puVar13 = (ulong *)((long)puVar13 + 1);
            uVar17 = 0;
          }
        }
        else {
          uVar18 = *puVar13;
          uVar20 = uVar18 >> 0x38 | (uVar18 & 0xff000000000000) >> 0x28 |
                   (uVar18 & 0xff0000000000) >> 0x18 | (uVar18 & 0xff00000000) >> 8 |
                   (uVar18 & 0xff000000) << 8 | (uVar18 & 0xff0000) << 0x18 |
                   (uVar18 & 0xff00) << 0x28 | uVar18 << 0x38;
          puVar13 = puVar13 + 1;
          uVar17 = uVar17 - 0x40;
        }
        iVar8 = 0x40;
        uVar18 = uVar19;
        uVar19 = uVar20;
        iVar11 = iVar7;
        iVar7 = 0x40;
      }
      lVar9 = -0x34;
      do {
        lVar24 = lVar9;
        lVar9 = lVar24 + 1;
      } while (uVar18 < fhd->_ljOffset[lVar24 + 5]);
      if (((ulong)fhd->_maxCodeLength < lVar24 + 0x41U) ||
         (uVar20 = (uVar18 >> (-(char)(lVar24 + 1) & 0x3fU)) +
                   *(long *)(fhd->_tableSymbol + lVar24 * 2 + 0xc), fhd->_numSymbols <= uVar20)) {
        if (pctxt == (exr_const_context_t)0x0) {
          bVar6 = false;
        }
        else {
          (*pctxt->print_error)(pctxt,0x17,"Huffman decode error (Decoded an invalid symbol)");
          bVar6 = false;
          auVar49 = _DAT_00136090;
          auVar50 = _DAT_001360a0;
          auVar51 = _DAT_001360b0;
          auVar52 = _DAT_001360c0;
          auVar53 = _DAT_001360e0;
        }
      }
      else {
        local_5c = fhd->_idToSymbol[uVar20];
        bVar6 = true;
      }
      uVar14 = (uint)(lVar24 + 0x41U);
      if (bVar6) goto LAB_001151dd;
      bVar6 = false;
    }
    else {
      uVar14 = (uint)fhd->_tableCodeLen[uVar18 >> 0x34];
      local_5c = fhd->_tableSymbol[uVar18 >> 0x34];
LAB_001151dd:
      uVar18 = uVar18 << ((byte)uVar14 & 0x3f);
      iVar8 = iVar8 - uVar14;
      if (local_5c == uVar2) {
        uVar20 = uVar18;
        iVar11 = iVar8;
        if (iVar8 < 8) {
          do {
            uVar18 = uVar19;
            if (0 < iVar8) {
              iVar11 = 0x40 - iVar8;
              uVar20 = uVar20 | uVar18 >> ((byte)iVar8 & 0x3f);
              if (iVar11 <= iVar7) {
                uVar19 = uVar18 << ((byte)iVar11 & 0x3f);
                uVar18 = uVar20;
                iVar7 = iVar7 - iVar11;
                iVar11 = 0x40;
                break;
              }
              uVar18 = uVar20;
              iVar7 = iVar8 + iVar7;
            }
            iVar8 = iVar7;
            if (uVar17 < 0x40) {
              if (uVar17 < 8) {
                lVar9 = 0x38;
                uVar19 = 0;
              }
              else {
                lVar9 = 0x38;
                uVar19 = 0;
                puVar16 = puVar13;
                do {
                  uVar19 = uVar19 | (ulong)(byte)*puVar16 << ((byte)lVar9 & 0x3f);
                  puVar16 = (ulong *)((long)puVar16 + 1);
                  lVar24 = lVar9 + uVar17;
                  lVar9 = lVar9 + -8;
                } while (7 < lVar24 - 0x40U);
                puVar13 = (ulong *)((long)puVar13 + (uVar17 - 8 >> 3) + 1);
                uVar17 = (uVar17 + lVar9) - 0x38;
              }
              if (uVar17 != 0) {
                uVar19 = uVar19 | (ulong)(byte)*puVar13 << ((byte)lVar9 & 0x3f);
                puVar13 = (ulong *)((long)puVar13 + 1);
                uVar17 = 0;
              }
            }
            else {
              uVar19 = *puVar13;
              uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                       (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                       (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                       (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
              puVar13 = puVar13 + 1;
              uVar17 = uVar17 - 0x40;
            }
            iVar7 = 0x40;
            iVar11 = 0x40;
            uVar20 = uVar18;
          } while (iVar8 < 0x40);
        }
        iVar8 = iVar11;
        if (local_78 == 0) {
          if (pctxt != (exr_const_context_t)0x0) {
            (*pctxt->print_error)
                      (pctxt,0x17,"Huffman decode error (RLE code with no previous symbol)");
            auVar49 = _DAT_00136090;
            auVar50 = _DAT_001360a0;
            auVar51 = _DAT_001360b0;
            auVar52 = _DAT_001360c0;
            auVar53 = _DAT_001360e0;
          }
          local_78 = 0;
          bVar6 = false;
        }
        else {
          uVar20 = uVar18 >> 0x38;
          if (numDstElems < local_78 + uVar20) {
            if (pctxt != (exr_const_context_t)0x0) {
              pcVar12 = "Huffman decode error (Symbol run beyond expected output buffer length)";
LAB_001157d6:
              (*pctxt->print_error)(pctxt,0x17,pcVar12);
              auVar49 = _DAT_00136090;
              auVar50 = _DAT_001360a0;
              auVar51 = _DAT_001360b0;
              auVar52 = _DAT_001360c0;
              auVar53 = _DAT_001360e0;
            }
          }
          else {
            if (uVar20 != 0) {
              lVar9 = uVar20 - 1;
              auVar21._8_4_ = (int)lVar9;
              auVar21._0_8_ = lVar9;
              auVar21._12_4_ = (int)((ulong)lVar9 >> 0x20);
              lVar9 = local_78 * 2;
              auVar21 = auVar21 ^ auVar53;
              uVar15 = 0;
              auVar23 = auVar52;
              auVar25 = auVar51;
              auVar26 = auVar50;
              auVar27 = auVar49;
              do {
                auVar28 = auVar23 ^ auVar53;
                iVar8 = auVar21._0_4_;
                iVar41 = -(uint)(iVar8 < auVar28._0_4_);
                iVar10 = auVar21._4_4_;
                auVar29._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                iVar45 = auVar21._8_4_;
                iVar44 = -(uint)(iVar45 < auVar28._8_4_);
                iVar22 = auVar21._12_4_;
                auVar29._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
                auVar38._4_4_ = iVar41;
                auVar38._0_4_ = iVar41;
                auVar38._8_4_ = iVar44;
                auVar38._12_4_ = iVar44;
                auVar46 = pshuflw(in_XMM8,auVar38,0xe8);
                auVar31._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                auVar31._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
                auVar31._0_4_ = auVar31._4_4_;
                auVar31._8_4_ = auVar31._12_4_;
                auVar48 = pshuflw(in_XMM9,auVar31,0xe8);
                auVar29._0_4_ = auVar29._4_4_;
                auVar29._8_4_ = auVar29._12_4_;
                auVar47 = pshuflw(auVar46,auVar29,0xe8);
                auVar28._8_4_ = 0xffffffff;
                auVar28._0_8_ = 0xffffffffffffffff;
                auVar28._12_4_ = 0xffffffff;
                auVar28 = (auVar47 | auVar48 & auVar46) ^ auVar28;
                auVar28 = packssdw(auVar28,auVar28);
                uVar1 = dst[local_78 - 1];
                if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9) = uVar1;
                }
                auVar29 = auVar31 & auVar38 | auVar29;
                auVar28 = packssdw(auVar29,auVar29);
                auVar47._8_4_ = 0xffffffff;
                auVar47._0_8_ = 0xffffffffffffffff;
                auVar47._12_4_ = 0xffffffff;
                auVar28 = packssdw(auVar28 ^ auVar47,auVar28 ^ auVar47);
                if ((auVar28._0_4_ >> 0x10 & 1) != 0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 2) = uVar1;
                }
                auVar28 = auVar25 ^ auVar53;
                iVar41 = -(uint)(iVar8 < auVar28._0_4_);
                auVar42._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                iVar44 = -(uint)(iVar45 < auVar28._8_4_);
                auVar42._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
                auVar30._4_4_ = iVar41;
                auVar30._0_4_ = iVar41;
                auVar30._8_4_ = iVar44;
                auVar30._12_4_ = iVar44;
                auVar37._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                auVar37._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
                auVar37._0_4_ = auVar37._4_4_;
                auVar37._8_4_ = auVar37._12_4_;
                auVar42._0_4_ = auVar42._4_4_;
                auVar42._8_4_ = auVar42._12_4_;
                auVar28 = auVar37 & auVar30 | auVar42;
                auVar28 = packssdw(auVar28,auVar28);
                auVar4._8_4_ = 0xffffffff;
                auVar4._0_8_ = 0xffffffffffffffff;
                auVar4._12_4_ = 0xffffffff;
                auVar28 = packssdw(auVar28 ^ auVar4,auVar28 ^ auVar4);
                if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 4) = uVar1;
                }
                auVar31 = pshufhw(auVar30,auVar30,0x84);
                auVar38 = pshufhw(auVar37,auVar37,0x84);
                auVar29 = pshufhw(auVar31,auVar42,0x84);
                auVar32._8_4_ = 0xffffffff;
                auVar32._0_8_ = 0xffffffffffffffff;
                auVar32._12_4_ = 0xffffffff;
                auVar32 = (auVar29 | auVar38 & auVar31) ^ auVar32;
                auVar31 = packssdw(auVar32,auVar32);
                if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 6) = uVar1;
                }
                auVar31 = auVar26 ^ auVar53;
                iVar41 = -(uint)(iVar8 < auVar31._0_4_);
                auVar34._4_4_ = -(uint)(iVar10 < auVar31._4_4_);
                iVar44 = -(uint)(iVar45 < auVar31._8_4_);
                auVar34._12_4_ = -(uint)(iVar22 < auVar31._12_4_);
                auVar39._4_4_ = iVar41;
                auVar39._0_4_ = iVar41;
                auVar39._8_4_ = iVar44;
                auVar39._12_4_ = iVar44;
                auVar28 = pshuflw(auVar28,auVar39,0xe8);
                auVar33._4_4_ = -(uint)(auVar31._4_4_ == iVar10);
                auVar33._12_4_ = -(uint)(auVar31._12_4_ == iVar22);
                auVar33._0_4_ = auVar33._4_4_;
                auVar33._8_4_ = auVar33._12_4_;
                auVar31 = pshuflw(auVar48 & auVar46,auVar33,0xe8);
                in_XMM9 = auVar31 & auVar28;
                auVar34._0_4_ = auVar34._4_4_;
                auVar34._8_4_ = auVar34._12_4_;
                auVar28 = pshuflw(auVar28,auVar34,0xe8);
                auVar46._8_4_ = 0xffffffff;
                auVar46._0_8_ = 0xffffffffffffffff;
                auVar46._12_4_ = 0xffffffff;
                auVar46 = (auVar28 | in_XMM9) ^ auVar46;
                auVar28 = packssdw(auVar46,auVar46);
                if ((auVar28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 8) = uVar1;
                }
                auVar34 = auVar33 & auVar39 | auVar34;
                auVar28 = packssdw(auVar34,auVar34);
                auVar48._8_4_ = 0xffffffff;
                auVar48._0_8_ = 0xffffffffffffffff;
                auVar48._12_4_ = 0xffffffff;
                auVar28 = packssdw(auVar28 ^ auVar48,auVar28 ^ auVar48);
                if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 10) = uVar1;
                }
                auVar28 = auVar27 ^ auVar53;
                iVar8 = -(uint)(iVar8 < auVar28._0_4_);
                auVar43._4_4_ = -(uint)(iVar10 < auVar28._4_4_);
                iVar45 = -(uint)(iVar45 < auVar28._8_4_);
                auVar43._12_4_ = -(uint)(iVar22 < auVar28._12_4_);
                auVar35._4_4_ = iVar8;
                auVar35._0_4_ = iVar8;
                auVar35._8_4_ = iVar45;
                auVar35._12_4_ = iVar45;
                auVar40._4_4_ = -(uint)(auVar28._4_4_ == iVar10);
                auVar40._12_4_ = -(uint)(auVar28._12_4_ == iVar22);
                auVar40._0_4_ = auVar40._4_4_;
                auVar40._8_4_ = auVar40._12_4_;
                auVar43._0_4_ = auVar43._4_4_;
                auVar43._8_4_ = auVar43._12_4_;
                auVar28 = auVar40 & auVar35 | auVar43;
                auVar28 = packssdw(auVar28,auVar28);
                auVar5._8_4_ = 0xffffffff;
                auVar5._0_8_ = 0xffffffffffffffff;
                auVar5._12_4_ = 0xffffffff;
                in_XMM8 = packssdw(auVar28 ^ auVar5,auVar28 ^ auVar5);
                if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 0xc) = uVar1;
                }
                auVar28 = pshufhw(auVar35,auVar35,0x84);
                auVar29 = pshufhw(auVar40,auVar40,0x84);
                auVar31 = pshufhw(auVar28,auVar43,0x84);
                auVar36._8_4_ = 0xffffffff;
                auVar36._0_8_ = 0xffffffffffffffff;
                auVar36._12_4_ = 0xffffffff;
                auVar36 = (auVar31 | auVar29 & auVar28) ^ auVar36;
                auVar28 = packssdw(auVar36,auVar36);
                if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  *(uint16_t *)((long)dst + uVar15 + lVar9 + 0xe) = uVar1;
                }
                lVar24 = auVar23._8_8_;
                auVar23._0_8_ = auVar23._0_8_ + 8;
                auVar23._8_8_ = lVar24 + 8;
                lVar24 = auVar25._8_8_;
                auVar25._0_8_ = auVar25._0_8_ + 8;
                auVar25._8_8_ = lVar24 + 8;
                lVar24 = auVar26._8_8_;
                auVar26._0_8_ = auVar26._0_8_ + 8;
                auVar26._8_8_ = lVar24 + 8;
                lVar24 = auVar27._8_8_;
                auVar27._0_8_ = auVar27._0_8_ + 8;
                auVar27._8_8_ = lVar24 + 8;
                uVar15 = uVar15 + 0x10;
              } while (((uint)(byte)(uVar18 >> 0x38) * 2 + 0xe & 0xfffffff0) != uVar15);
              uVar18 = uVar18 << 8;
              bVar6 = true;
              local_78 = local_78 + uVar20;
              iVar8 = iVar11 + -8;
              goto LAB_001155a0;
            }
            if (pctxt != (exr_const_context_t)0x0) {
              pcVar12 = "Huffman decode error (Invalid RLE length)";
              goto LAB_001157d6;
            }
          }
          bVar6 = false;
        }
LAB_001155a0:
        if (!bVar6) {
          bVar6 = false;
          goto LAB_001156a0;
        }
      }
      else {
        dst[local_78] = (uint16_t)local_5c;
        local_78 = local_78 + 1;
      }
      bVar6 = true;
      uVar20 = uVar18;
      iVar11 = iVar7;
      if (iVar8 < 0xc) {
        do {
          uVar18 = uVar19;
          if (0 < iVar8) {
            iVar10 = 0x40 - iVar8;
            uVar18 = uVar20 | uVar19 >> ((byte)iVar8 & 0x3f);
            iVar7 = iVar11 - iVar10;
            if (iVar10 <= iVar11) {
              uVar19 = uVar19 << ((byte)iVar10 & 0x3f);
              iVar8 = 0x40;
              goto LAB_001156a0;
            }
            iVar11 = iVar8 + iVar11;
          }
          iVar8 = iVar11;
          if (uVar17 < 0x40) {
            if (uVar17 < 8) {
              lVar9 = 0x38;
              uVar19 = 0;
            }
            else {
              lVar9 = 0x38;
              uVar19 = 0;
              puVar16 = puVar13;
              do {
                uVar19 = uVar19 | (ulong)(byte)*puVar16 << ((byte)lVar9 & 0x3f);
                puVar16 = (ulong *)((long)puVar16 + 1);
                lVar24 = lVar9 + uVar17;
                lVar9 = lVar9 + -8;
              } while (7 < lVar24 - 0x40U);
              puVar13 = (ulong *)((long)puVar13 + (uVar17 - 8 >> 3) + 1);
              uVar17 = (uVar17 + lVar9) - 0x38;
            }
            if (uVar17 != 0) {
              uVar19 = uVar19 | (ulong)(byte)*puVar13 << ((byte)lVar9 & 0x3f);
              puVar13 = (ulong *)((long)puVar13 + 1);
              uVar17 = 0;
            }
          }
          else {
            uVar19 = *puVar13;
            uVar19 = uVar19 >> 0x38 | (uVar19 & 0xff000000000000) >> 0x28 |
                     (uVar19 & 0xff0000000000) >> 0x18 | (uVar19 & 0xff00000000) >> 8 |
                     (uVar19 & 0xff000000) << 8 | (uVar19 & 0xff0000) << 0x18 |
                     (uVar19 & 0xff00) << 0x28 | uVar19 << 0x38;
            puVar13 = puVar13 + 1;
            uVar17 = uVar17 - 0x40;
          }
          iVar7 = 0x40;
          uVar20 = uVar18;
          iVar11 = iVar7;
        } while (iVar8 < 0x40);
        iVar8 = 0x40;
      }
    }
LAB_001156a0:
    if (!bVar6) {
      return 0x17;
    }
  } while( true );
}

Assistant:

static exr_result_t
fasthuf_decode (
    exr_const_context_t         pctxt,
    FastHufDecoder* NO_ALIAS    fhd,
    const uint8_t* NO_ALIAS     src,
    uint64_t                    numSrcBits,
    uint16_t* NO_ALIAS          dst,
    uint64_t                    numDstElems)
{
    //
    // Current position (byte/bit) in the src data stream
    // (after the first buffer fill)
    //
    uint64_t buffer, bufferBack, dstIdx, tMin;
    int      bufferNumBits, bufferBackNumBits;
    uint32_t rleSym;

    const uint8_t* NO_ALIAS currByte = src + 2 * sizeof (uint64_t);

    numSrcBits -= 8 * 2 * sizeof (uint64_t);

    //
    // 64-bit buffer holding the current bits in the stream
    //

    buffer        = READ64 (src);
    bufferNumBits = 64;

    //
    // 64-bit buffer holding the next bits in the stream
    //

    bufferBack        = READ64 ((src + sizeof (uint64_t)));
    bufferBackNumBits = 64;
    dstIdx            = 0;

    tMin = fhd->_tableMin;
    rleSym = fhd->_rleSymbol;

    while (dstIdx < numDstElems)
    {
        int symbol, codeLen;

        //
        // Test if we can be table accelerated. If so, directly
        // lookup the output symbol. Otherwise, we need to fall
        // back to searching for the code.
        //
        // If we're doing table lookups, we don't really need
        // a re-filled buffer, so long as we have TABLE_LOOKUP_BITS
        // left. But for a search, we do need a refilled table.
        //

        if (tMin <= buffer)
        {
            int tableIdx = buffer >> INDEX_BIT_SHIFT;
            codeLen = fhd->_tableCodeLen[tableIdx];
            symbol  = fhd->_tableSymbol[tableIdx];
        }
        else
        {
            uint64_t id;

            if (bufferNumBits < 64)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);
                bufferNumBits = 64;
            }

            //
            // Brute force search:
            // Find the smallest length where _ljBase[length] <= buffer
            //

            codeLen = TABLE_LOOKUP_BITS + 1;

            /* sentinel zero can never be greater than buffer */
            /* && codeLen <= _maxCodeLength */
            while (fhd->_ljBase[codeLen] > buffer)
                codeLen++;

            if (OUR_UNLIKELY(codeLen > fhd->_maxCodeLength))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            id = fhd->_ljOffset[codeLen] + (buffer >> (64 - codeLen));
            if (OUR_LIKELY(id < (uint64_t) fhd->_numSymbols))
            {
                symbol = fhd->_idToSymbol[id];
            }
            else
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Decoded an invalid symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

        }

        //
        // Shift over bit stream, and update the bit count in the buffer
        //

        buffer = buffer << codeLen;
        bufferNumBits -= codeLen;

        //
        // If we received a RLE symbol (_rleSymbol), then we need
        // to read ahead 8 bits to know how many times to repeat
        // the previous symbol. Need to ensure we at least have
        // 8 bits of data in the buffer
        //

        if (symbol == rleSym)
        {
            uint32_t rleCount;

            if (bufferNumBits < 8)
            {
                FastHufDecoder_refill (
                    &buffer,
                    bufferNumBits,
                    &bufferBack,
                    &bufferBackNumBits,
                    &currByte,
                    &numSrcBits);

                bufferNumBits = 64;
            }

            rleCount = buffer >> 56;

            if (OUR_UNLIKELY(dstIdx < 1))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (RLE code with no previous symbol)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(dstIdx + (uint64_t) rleCount > numDstElems))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Symbol run beyond expected output buffer length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            if (OUR_UNLIKELY(rleCount == 0 || rleCount >= (uint32_t)INT32_MAX))
            {
                if (pctxt)
                    pctxt->print_error (
                        pctxt,
                        EXR_ERR_CORRUPT_CHUNK,
                        "Huffman decode error (Invalid RLE length)");
                return EXR_ERR_CORRUPT_CHUNK;
            }

            for (uint32_t i = 0; i < rleCount; ++i)
                dst[dstIdx + (uint64_t) i] = dst[dstIdx - 1];

            dstIdx += rleCount;

            buffer = buffer << 8;
            bufferNumBits -= 8;
        }
        else
        {
            dst[dstIdx] = (uint16_t) symbol;
            dstIdx++;
        }

        //
        // refill bit stream buffer if we're below the number of
        // bits needed for a table lookup
        //

        if (bufferNumBits < TABLE_LOOKUP_BITS)
        {
            FastHufDecoder_refill (
                &buffer,
                bufferNumBits,
                &bufferBack,
                &bufferBackNumBits,
                &currByte,
                &numSrcBits);

            bufferNumBits = 64;
        }
    }

    if (OUR_UNLIKELY(numSrcBits != 0))
    {
        if (pctxt)
            pctxt->print_error (
                pctxt,
                EXR_ERR_CORRUPT_CHUNK,
                "Huffman decode error (%d bits of compressed data remains after filling expected output buffer)",
                (int) numSrcBits);
        return EXR_ERR_CORRUPT_CHUNK;
    }

    return EXR_ERR_SUCCESS;
}